

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O1

void __thiscall
S2Polygon::InitOriented
          (S2Polygon *this,
          vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
          *loops)

{
  _Rb_tree_header *p_Var1;
  byte bVar2;
  __uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_> _Var3;
  S2Loop *pSVar4;
  byte bVar5;
  bool bVar6;
  pointer puVar7;
  _Head_base<0UL,_S2Loop_*,_false> _Var8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  ulong uVar11;
  uint uVar12;
  _Rb_tree_header *p_Var13;
  double dVar14;
  S2Loop *loop;
  set<const_S2Loop_*,_std::less<const_S2Loop_*>,_std::allocator<const_S2Loop_*>_> contained_origin;
  S2LogMessage local_98;
  double local_88;
  vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  local_78;
  _Rb_tree<const_S2Loop_*,_const_S2Loop_*,_std::_Identity<const_S2Loop_*>,_std::less<const_S2Loop_*>,_std::allocator<const_S2Loop_*>_>
  local_60;
  
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_78.
  super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (loops->
       super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_78.
  super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (loops->
       super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (local_78.
      super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_78.
      super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar11 = 0;
    do {
      local_98._0_8_ =
           local_78.
           super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_t.
           super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t.
           super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
           super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl;
      if (((S2Loop *)local_98._0_8_)->origin_inside_ == true) {
        std::
        _Rb_tree<S2Loop_const*,S2Loop_const*,std::_Identity<S2Loop_const*>,std::less<S2Loop_const*>,std::allocator<S2Loop_const*>>
        ::_M_insert_unique<S2Loop_const*const&>
                  ((_Rb_tree<S2Loop_const*,S2Loop_const*,std::_Identity<S2Loop_const*>,std::less<S2Loop_const*>,std::allocator<S2Loop_const*>>
                    *)&local_60,(S2Loop **)&local_98);
      }
      local_88 = S2Loop::GetCurvature((S2Loop *)local_98._0_8_);
      dVar14 = S2Loop::GetCurvatureMaxError((S2Loop *)local_98._0_8_);
      if (ABS(local_88) <= dVar14) {
        if (*(bool *)(local_98._0_8_ + 0x1a) == true) goto LAB_0020b732;
      }
      else if (local_88 < 0.0) {
LAB_0020b732:
        S2Loop::Invert((S2Loop *)local_98._0_8_);
      }
      uVar11 = uVar11 + 1;
      local_78.
      super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (loops->
           super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      local_78.
      super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (loops->
           super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    } while (uVar11 < (ulong)((long)local_78.
                                    super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_78.
                                    super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  local_78.
  super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (loops->
       super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (loops->
  super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (loops->
  super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (loops->
  super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  InitNested(this,&local_78);
  std::
  vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  ::~vector(&local_78);
  puVar7 = (this->loops_).
           super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar12 = (uint)((ulong)((long)(this->loops_).
                                super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)puVar7) >> 3);
  if (0 < (int)uVar12) {
    _Var8._M_head_impl =
         *(S2Loop **)
          &(puVar7->_M_t).super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t;
    uVar11 = 0;
    bVar5 = 0;
    do {
      _Var3._M_t.super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
      super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl =
           puVar7[uVar11]._M_t.super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t;
      bVar2 = *(byte *)((long)_Var3._M_t.
                              super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
                              super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl + 0x1a);
      if (bVar2 != 0) {
        _Var8._M_head_impl =
             (S2Loop *)
             _Var3._M_t.super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
             super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl;
      }
      bVar5 = bVar5 ^ bVar2;
      uVar11 = uVar11 + 1;
      p_Var10 = &p_Var1->_M_header;
      p_Var9 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
    } while ((uVar12 & 0x7fffffff) != uVar11);
    for (; (_Rb_tree_header *)p_Var9 != (_Rb_tree_header *)0x0;
        p_Var9 = (&p_Var9->_M_left)[*(S2Loop **)(p_Var9 + 1) < _Var8._M_head_impl]) {
      if (*(S2Loop **)(p_Var9 + 1) >= _Var8._M_head_impl) {
        p_Var10 = p_Var9;
      }
    }
    p_Var13 = p_Var1;
    if (((_Rb_tree_header *)p_Var10 != p_Var1) &&
       (p_Var13 = (_Rb_tree_header *)p_Var10,
       _Var8._M_head_impl < (S2Loop *)((_Rb_tree_header *)p_Var10)->_M_node_count)) {
      p_Var13 = p_Var1;
    }
    if (((p_Var13 == p_Var1 ^ bVar5) & 1) == 0) {
      Invert(this);
    }
  }
  puVar7 = (this->loops_).
           super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->loops_).
      super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar7) {
    uVar11 = 0;
    do {
      pSVar4 = puVar7[uVar11]._M_t.super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t.
               super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
               super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl;
      p_Var9 = &p_Var1->_M_header;
      for (p_Var10 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var10 != (_Base_ptr)0x0;
          p_Var10 = (&p_Var10->_M_left)[*(S2Loop **)(p_Var10 + 1) < pSVar4]) {
        if (*(S2Loop **)(p_Var10 + 1) >= pSVar4) {
          p_Var9 = p_Var10;
        }
      }
      p_Var10 = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var9 != p_Var1) &&
         (p_Var10 = p_Var9, pSVar4 < *(S2Loop **)(p_Var9 + 1))) {
        p_Var10 = &p_Var1->_M_header;
      }
      if ((((((pSVar4->origin_inside_ == ((_Rb_tree_header *)p_Var10 != p_Var1) ^
              (byte)pSVar4->depth_) & 1) == 0) &&
           (this->error_inconsistent_loop_orientations_ = '\x01', FLAGS_s2debug == true)) &&
          (this->s2debug_override_ == ALLOW)) && (bVar6 = IsValid(this), !bVar6)) {
        S2LogMessage::S2LogMessage
                  (&local_98,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polygon.cc"
                   ,0x1bf,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_98.stream_,"Check failed: IsValid() ",0x18);
        if (!bVar6) {
          abort();
        }
      }
      uVar11 = uVar11 + 1;
      puVar7 = (this->loops_).
               super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar11 < (ulong)((long)(this->loops_).
                                    super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar7 >> 3))
    ;
  }
  std::
  _Rb_tree<const_S2Loop_*,_const_S2Loop_*,_std::_Identity<const_S2Loop_*>,_std::less<const_S2Loop_*>,_std::allocator<const_S2Loop_*>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void S2Polygon::InitOriented(vector<unique_ptr<S2Loop>> loops) {
  // Here is the algorithm:
  //
  // 1. Remember which of the given loops contain S2::Origin().
  //
  // 2. Invert loops as necessary to ensure that they are nestable (i.e., no
  //    loop contains the complement of any other loop).  This may result in a
  //    set of loops corresponding to the complement of the given polygon, but
  //    we will fix that problem later.
  //
  //    We make the loops nestable by first normalizing all the loops (i.e.,
  //    inverting any loops whose curvature is negative).  This handles
  //    all loops except those whose curvature is very close to zero
  //    (within the maximum error tolerance).  Any such loops are inverted if
  //    and only if they contain S2::Origin().  (In theory this step is only
  //    necessary if there are at least two such loops.)  The resulting set of
  //    loops is guaranteed to be nestable.
  //
  // 3. Build the polygon.  This yields either the desired polygon or its
  //    complement.
  //
  // 4. If there is at least one loop, we find a loop L that is adjacent to
  //    S2::Origin() (where "adjacent" means that there exists a path
  //    connecting S2::Origin() to some vertex of L such that the path does
  //    not cross any loop).  There may be a single such adjacent loop, or
  //    there may be several (in which case they should all have the same
  //    contains_origin() value).  We choose L to be the loop containing the
  //    origin whose depth is greatest, or loop(0) (a top-level shell) if no
  //    such loop exists.
  //
  // 5. If (L originally contained origin) != (polygon contains origin), we
  //    invert the polygon.  This is done by inverting a top-level shell whose
  //    curvature is minimal and then fixing the nesting hierarchy.  Note
  //    that because we normalized all the loops initially, this step is only
  //    necessary if the polygon requires at least one non-normalized loop to
  //    represent it.

  set<const S2Loop*> contained_origin;
  for (int i = 0; i < loops.size(); ++i) {
    S2Loop* loop = loops[i].get();
    if (loop->contains_origin()) {
      contained_origin.insert(loop);
    }
    double angle = loop->GetCurvature();
    if (fabs(angle) > loop->GetCurvatureMaxError()) {
      // Normalize the loop.
      if (angle < 0) loop->Invert();
    } else {
      // Ensure that the loop does not contain the origin.
      if (loop->contains_origin()) loop->Invert();
    }
  }
  InitNested(std::move(loops));
  if (num_loops() > 0) {
    S2Loop* origin_loop = loop(0);
    bool polygon_contains_origin = false;
    for (int i = 0; i < num_loops(); ++i) {
      if (loop(i)->contains_origin()) {
        polygon_contains_origin ^= true;
        origin_loop = loop(i);
      }
    }
    if (contained_origin.count(origin_loop) != polygon_contains_origin) {
      Invert();
    }
  }
  // Verify that the original loops had consistent shell/hole orientations.
  // Each original loop L should have been inverted if and only if it now
  // represents a hole.
  for (int i = 0; i < loops_.size(); ++i) {
    if ((contained_origin.count(loop(i)) != loop(i)->contains_origin()) !=
        loop(i)->is_hole()) {
      // There is no point in saving the loop index, because the error is a
      // property of the entire set of loops.  In general there is no way to
      // determine which ones are incorrect.
      error_inconsistent_loop_orientations_ = true;
      if (FLAGS_s2debug && s2debug_override_ == S2Debug::ALLOW) {
        // The FLAGS_s2debug validity checking usually happens in InitIndex(),
        // but this error is detected too late for that.
        S2_CHECK(IsValid());  // Always fails.
      }
    }
  }
}